

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O1

void __thiscall
EncodeHelper::Init(EncodeHelper *this,size_t _cbNeeded,uchar *pOut,size_t cbOut,uchar type,
                  size_t cbData)

{
  size_t cbOut_00;
  overflow_error *this_00;
  
  this->cbNeeded = _cbNeeded;
  if ((_cbNeeded <= cbOut) && (1 < cbOut)) {
    *pOut = type;
    this->offset = 1;
    cbOut_00 = DataSize(this);
    EncodeSize(cbData,pOut + 1,cbOut_00,&this->cbCurrent);
    this->offset = this->offset + this->cbCurrent;
    this->cbCurrent = 0;
    return;
  }
  this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
  std::overflow_error::overflow_error(this_00,"Overflow in Encode");
  __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
}

Assistant:

void Init(size_t _cbNeeded, unsigned char* pOut, size_t cbOut, unsigned char type, size_t cbData)
    { 
        cbNeeded = _cbNeeded; 
        if(cbNeeded > cbOut || cbOut < 2)
            throw std::overflow_error("Overflow in Encode");

        // Set the type
        *pOut = type;
        offset = 1;

        EncodeSize(cbData, DataPtr(pOut), DataSize(), CurrentSize());
        Update();
    }